

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O0

int __thiscall
QFileSelector::select
          (QFileSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  bool bVar1;
  byte bVar2;
  QFileSelectorPrivate *pQVar3;
  fd_set *__writefds_00;
  undefined4 in_register_00000034;
  QString *localFile;
  long in_FS_OFFSET;
  QFileSelectorPrivate *d;
  QUrl *ret;
  QString query;
  QString frag;
  QString selectedPath;
  QString equivalentPath;
  QLatin1StringView scheme;
  undefined4 in_stack_fffffffffffffde8;
  ComponentFormattingOption in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  ParsingMode in_stack_fffffffffffffdf4;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  QUrl *in_stack_fffffffffffffe00;
  QUrl *this_00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  QUrl *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  byte bVar4;
  byte bVar5;
  QFileSelector *pQVar6;
  QFlagsStorage<QUrl::ComponentFormattingOption> options;
  QFlagsStorage<QUrl::ComponentFormattingOption> options_00;
  undefined1 local_180 [48];
  QUrl local_150 [5];
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [104];
  anon_union_8_2_04744d9a_for_QObjectPrivate_13 aStack_60;
  QAtomicPointer<QtSharedPointer::ExternalRefCountData> local_58;
  QLatin1StringView local_48 [2];
  undefined1 local_20 [24];
  long local_8;
  
  localFile = (QString *)CONCAT44(in_register_00000034,__nfds);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = this;
  pQVar3 = d_func((QFileSelector *)0x2b2fce);
  options_00.i = (Int)((ulong)local_20 >> 0x20);
  QUrl::scheme((QUrl *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  bVar1 = isLocalScheme((QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  __writefds_00 = (fd_set *)CONCAT71((int7)((ulong)__writefds >> 8),bVar1);
  bVar4 = 0;
  if (!bVar1) {
    in_stack_fffffffffffffe36 =
         QUrl::isLocalFile((QUrl *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    bVar4 = in_stack_fffffffffffffe36 ^ 0xff;
  }
  bVar5 = bVar4;
  QString::~QString((QString *)0x2b3040);
  if ((bVar4 & 1) == 0) {
    (pQVar6->super_QObject)._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (QUrl *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    options.i = (Int)((ulong)pQVar6 >> 0x20);
    QUrl::scheme((QUrl *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar2 = isLocalScheme((QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    QString::~QString((QString *)0x2b30e0);
    if ((bVar2 & 1) == 0) {
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x2b3355);
      bVar1 = QUrl::hasFragment((QUrl *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ));
      if (bVar1) {
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
        QUrl::fragment((QUrl *)CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffe36,
                                                       CONCAT15(bVar4,CONCAT14(bVar2,
                                                  in_stack_fffffffffffffe30)))),
                       (ComponentFormattingOptions)options_00.i);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
        ;
        QString::~QString((QString *)0x2b33bb);
      }
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x2b3402);
      bVar1 = QUrl::hasQuery((QUrl *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      if (bVar1) {
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
        QUrl::query((QUrl *)CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffe36,
                                                    CONCAT15(bVar4,CONCAT14(bVar2,
                                                  in_stack_fffffffffffffe30)))),
                    (ComponentFormattingOptions)options_00.i);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
        ;
        QString::~QString((QString *)0x2b3468);
      }
      QUrl::toLocalFile((QUrl *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      QFileSelectorPrivate::select
                ((QFileSelectorPrivate *)(local_180 + 0x18),(int)pQVar3,(fd_set *)local_180,
                 __writefds_00,__exceptfds,__timeout);
      QUrl::fromLocalFile(localFile);
      this_00 = local_150;
      QUrl::operator=((QUrl *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      (QUrl *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      QUrl::~QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      QString::~QString((QString *)0x2b3500);
      QString::~QString((QString *)0x2b350d);
      bVar1 = QString::isNull((QString *)0x2b351a);
      if (!bVar1) {
        QUrl::setFragment(this_00,(QString *)
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                          in_stack_fffffffffffffdf4);
      }
      bVar1 = QString::isNull((QString *)0x2b3591);
      if (!bVar1) {
        QUrl::setQuery(this_00,(QString *)CONCAT17(bVar1,in_stack_fffffffffffffdf8),
                       in_stack_fffffffffffffdf4);
      }
      QString::~QString((QString *)0x2b35c6);
      QString::~QString((QString *)0x2b35d3);
    }
    else {
      local_48[0].m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_48[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48[0] = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                               ,CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_58.super_QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>._q_value._M_b._M_p =
           (QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>)&DAT_aaaaaaaaaaaaaaaa;
      local_c8._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
      aStack_60.currentChildBeingDeleted = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
      QUrl::path(in_stack_fffffffffffffe20,(ComponentFormattingOptions)options.i);
      ::operator+((QLatin1String *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                  (QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String_&,_QString> *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      QStringBuilder<QLatin1String_&,_QString>::~QStringBuilder
                ((QStringBuilder<QLatin1String_&,_QString> *)0x2b31bb);
      QString::~QString((QString *)0x2b31c8);
      local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileSelectorPrivate::select
                ((QFileSelectorPrivate *)local_c8,(int)pQVar3,(fd_set *)(local_c8 + 0x60),
                 __writefds_00,__exceptfds,__timeout);
      QLatin1String::size(local_48);
      QString::remove((QString *)local_c8,(char *)0x0);
      QUrl::setPath(in_stack_fffffffffffffe00,
                    (QString *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                    in_stack_fffffffffffffdf4);
      QString::~QString((QString *)0x2b3250);
      QString::~QString((QString *)0x2b325d);
    }
  }
  else {
    QUrl::QUrl((QUrl *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (QUrl *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QFileSelector::select(const QUrl &filePath) const
{
    Q_D(const QFileSelector);
    if (!isLocalScheme(filePath.scheme()) && !filePath.isLocalFile())
        return filePath;
    QUrl ret(filePath);
    if (isLocalScheme(filePath.scheme())) {
        auto scheme = ":"_L1;
#ifdef Q_OS_ANDROID
        // use other scheme because ":" means "qrc" here
        if (filePath.scheme() == "assets"_L1)
            scheme = "assets:"_L1;
#endif

        QString equivalentPath = scheme + filePath.path();
        QString selectedPath = d->select(equivalentPath);
        ret.setPath(selectedPath.remove(0, scheme.size()));
    } else {
        // we need to store the original query and fragment, since toLocalFile() will strip it off
        QString frag;
        if (ret.hasFragment())
            frag = ret.fragment();
        QString query;
        if (ret.hasQuery())
            query= ret.query();
        ret = QUrl::fromLocalFile(d->select(ret.toLocalFile()));
        if (!frag.isNull())
            ret.setFragment(frag);
        if (!query.isNull())
            ret.setQuery(query);
    }
    return ret;
}